

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O1

insert_result * __thiscall
crnlib::
hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
::insert(insert_result *__return_storage_ptr__,
        hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
        *this,unsigned_long_long *k,empty_type *v)

{
  raw_node *prVar1;
  bool bVar2;
  bool bVar3;
  unsigned_long_long uVar4;
  raw_node *prVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  
  (__return_storage_ptr__->first).m_pTable = (hash_map_type *)0x0;
  (__return_storage_ptr__->first).m_index = 0;
  __return_storage_ptr__->second = false;
  uVar9 = (this->m_values).m_size;
  if (uVar9 == 0) {
LAB_0014f467:
    uVar11 = (this->m_values).m_size * 2;
    uVar9 = 4;
    if (4 < uVar11) {
      uVar9 = uVar11;
    }
    rehash(this,uVar9);
    uVar9 = (this->m_values).m_size;
    if (uVar9 != 0) {
      uVar4 = *k;
      uVar11 = (uint)((int)uVar4 * -0x61c88647) >> ((byte)this->m_hash_shift & 0x1f);
      uVar8 = (ulong)uVar11;
      prVar1 = (this->m_values).m_p;
      prVar5 = prVar1 + uVar8;
      if (prVar1[uVar8].m_bits[9] != '\0') {
        if (*(unsigned_long_long *)prVar5->m_bits == uVar4) {
LAB_0014f4b7:
          (__return_storage_ptr__->first).m_pTable = this;
          (__return_storage_ptr__->first).m_index = uVar11;
          __return_storage_ptr__->second = false;
          return __return_storage_ptr__;
        }
        uVar10 = (ulong)(uVar9 - 1);
        do {
          iVar6 = (int)uVar8;
          uVar8 = (ulong)(iVar6 - 1);
          if (iVar6 == 0) {
            uVar8 = uVar10;
          }
          uVar7 = (uint)uVar8;
          prVar5 = prVar5 + -1;
          if (iVar6 == 0) {
            prVar5 = prVar1 + uVar10;
          }
          bVar2 = uVar11 != uVar7;
          if (uVar11 == uVar7) {
LAB_0014f50e:
            bVar3 = false;
            goto LAB_0014f510;
          }
          if (prVar5->m_bits[9] == '\0') {
            bVar2 = true;
            goto LAB_0014f50e;
          }
        } while (*(unsigned_long_long *)prVar5->m_bits != uVar4);
        (__return_storage_ptr__->first).m_pTable = this;
        (__return_storage_ptr__->first).m_index = uVar7;
        __return_storage_ptr__->second = false;
        bVar3 = true;
        bVar2 = false;
LAB_0014f510:
        uVar11 = uVar7;
        if (!bVar2) {
          if (bVar3) {
            return __return_storage_ptr__;
          }
          goto LAB_0014f541;
        }
      }
      if (this->m_num_valid < this->m_grow_threshold) goto LAB_0014f51f;
    }
LAB_0014f541:
    crnlib_fail("\"insert() failed\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DaemonEngine[P]crunch/crnlib/crn_hash_map.h"
                ,0x15d);
  }
  else {
    uVar4 = *k;
    uVar11 = (uint)((int)uVar4 * -0x61c88647) >> ((byte)this->m_hash_shift & 0x1f);
    uVar8 = (ulong)uVar11;
    prVar1 = (this->m_values).m_p;
    prVar5 = prVar1 + uVar8;
    if (prVar1[uVar8].m_bits[9] != '\0') {
      if (*(unsigned_long_long *)prVar5->m_bits == uVar4) goto LAB_0014f4b7;
      uVar10 = (ulong)(uVar9 - 1);
      do {
        iVar6 = (int)uVar8;
        uVar8 = (ulong)(iVar6 - 1);
        if (iVar6 == 0) {
          uVar8 = uVar10;
        }
        uVar7 = (uint)uVar8;
        prVar5 = prVar5 + -1;
        if (iVar6 == 0) {
          prVar5 = prVar1 + uVar10;
        }
        bVar2 = uVar11 != uVar7;
        if (uVar11 == uVar7) {
LAB_0014f448:
          bVar3 = false;
          goto LAB_0014f44a;
        }
        if (prVar5->m_bits[9] == '\0') {
          bVar2 = true;
          goto LAB_0014f448;
        }
      } while (*(unsigned_long_long *)prVar5->m_bits != uVar4);
      (__return_storage_ptr__->first).m_pTable = this;
      (__return_storage_ptr__->first).m_index = uVar7;
      __return_storage_ptr__->second = false;
      bVar3 = true;
      bVar2 = false;
LAB_0014f44a:
      uVar11 = uVar7;
      if (!bVar2) {
        if (bVar3) {
          return __return_storage_ptr__;
        }
        goto LAB_0014f467;
      }
    }
    if (this->m_grow_threshold <= this->m_num_valid) goto LAB_0014f467;
LAB_0014f51f:
    *(unsigned_long_long *)prVar5->m_bits = uVar4;
    *(empty_type *)(prVar5->m_bits + 8) = *v;
    prVar5->m_bits[9] = '\x01';
    this->m_num_valid = this->m_num_valid + 1;
    (__return_storage_ptr__->first).m_pTable = this;
    (__return_storage_ptr__->first).m_index = uVar11;
    __return_storage_ptr__->second = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value()) {
    insert_result result;
    if (!insert_no_grow(result, k, v)) {
      grow();

      // This must succeed.
      if (!insert_no_grow(result, k, v)) {
        CRNLIB_FAIL("insert() failed");
      }
    }

    return result;
  }